

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined8 uVar1;
  size_t sVar2;
  pointer pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  Vector3f wiRender;
  Vector3f wiRender_00;
  Interval<float> IVar9;
  Interval<float> IVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [20];
  bool bVar15;
  int iVar16;
  BxDFFlags BVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  DebugMLTSampler *pDVar22;
  ImageInfiniteLight *this_00;
  HaltonSampler *pHVar23;
  DiffuseBxDF *pDVar24;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *pLVar25;
  PrimitiveHandle *this_01;
  LightHandle *light;
  pointer pLVar26;
  uintptr_t uVar27;
  long in_FS_OFFSET;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Float FVar33;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar81 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar79 [64];
  undefined4 uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar94 [56];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 in_ZMM6 [64];
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  SampledSpectrum SVar95;
  undefined1 local_378 [8];
  undefined4 uStack_370;
  undefined4 uStack_36c;
  DispatchSplit<9> local_359;
  SampledSpectrum f;
  Tuple3<pbrt::Vector3,_float> local_348;
  float fStack_33c;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined1 local_328 [16];
  SampledSpectrum beta;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined4 local_2cc;
  undefined1 local_2c8 [16];
  Interval<float> *local_2b0;
  PrimitiveHandle *local_2a8;
  SamplerHandle *local_2a0;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_298;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_290;
  LightLiSample ls;
  undefined8 local_208;
  uintptr_t local_200;
  anon_struct_8_0_00000001_for___align local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  SampledSpectrum *local_1c8;
  undefined8 *puStack_1c0;
  undefined8 *puStack_1b8;
  undefined4 *puStack_1b0;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar55 [64];
  undefined1 auVar80 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_29 [56];
  undefined1 extraout_var_30 [56];
  undefined1 auVar88 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  
  beta.values.values[0] = 1.0;
  beta.values.values[1] = 1.0;
  beta.values.values[2] = 1.0;
  beta.values.values[3] = 1.0;
  this_01 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  _local_2e8 = ZEXT816(0);
  local_2b0 = (Interval<float> *)&ray->hasDifferentials;
  local_378._0_4_ = 1;
  iVar18 = 0;
  local_2a8 = this_01;
  local_2a0 = sampler;
  do {
    if ((beta.values.values[0] == 0.0) && (!NAN(beta.values.values[0]))) {
      uVar19 = 0;
      while (uVar20 = uVar19, uVar20 != 3) {
        fVar34 = beta.values.values[uVar20 + 1];
        if ((fVar34 != 0.0) || (uVar19 = uVar20 + 1, NAN(fVar34))) break;
      }
      if (2 < uVar20) break;
    }
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((this_01->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      si.optionalValue._0_64_ = ZEXT464(0) << 0x20;
      si.set = false;
      si._257_7_ = 0;
      si.optionalValue._64_64_ = si.optionalValue._0_64_;
      si.optionalValue._128_64_ = si.optionalValue._0_64_;
      si.optionalValue._192_64_ = si.optionalValue._0_64_;
    }
    else {
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      PrimitiveHandle::Intersect(&si,this_01,&ray->super_Ray,INFINITY);
    }
    if (si.set == false) {
      if ((this->sampleLights != true) ||
         (bVar15 = true, (_local_378 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        pLVar3 = *(pointer *)
                  ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                          infiniteLights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data + 8);
        bVar15 = true;
        for (pLVar26 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                       infiniteLights.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start; this_01 = local_2a8,
            sampler = local_2a0, pLVar26 != pLVar3; pLVar26 = pLVar26 + 1) {
          uVar19 = (pLVar26->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar29 = ZEXT816(0) << 0x40;
          auVar31 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar19) {
            this_00 = (ImageInfiniteLight *)(uVar19 & 0xffffffffffff);
            auVar29 = in_ZMM6._0_16_;
            if (uVar19 >> 0x30 == 8) {
              auVar81 = ZEXT856(0);
              auVar94 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar29);
              SVar95 = ImageInfiniteLight::Le(this_00,&ray->super_Ray,lambda);
              auVar90._0_8_ = SVar95.values.values._8_8_;
              auVar90._8_56_ = auVar94;
              auVar31 = auVar90._0_16_;
              auVar45._0_8_ = SVar95.values.values._0_8_;
              auVar45._8_56_ = auVar81;
              auVar29 = auVar45._0_16_;
            }
            else if ((short)(uVar19 >> 0x30) == 7) {
              auVar81 = ZEXT856(0);
              auVar94 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar29);
              SVar95 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)this_00,&ray->super_Ray,lambda);
              auVar89._0_8_ = SVar95.values.values._8_8_;
              auVar89._8_56_ = auVar94;
              auVar31 = auVar89._0_16_;
              auVar44._0_8_ = SVar95.values.values._0_8_;
              auVar44._8_56_ = auVar81;
              auVar29 = auVar44._0_16_;
            }
            else {
              auVar81 = ZEXT856(0);
              auVar94 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar29);
              SVar95 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)this_00,&ray->super_Ray,lambda);
              auVar91._0_8_ = SVar95.values.values._8_8_;
              auVar91._8_56_ = auVar94;
              auVar31 = auVar91._0_16_;
              auVar46._0_8_ = SVar95.values.values._0_8_;
              auVar46._8_56_ = auVar81;
              auVar29 = auVar46._0_16_;
            }
          }
          auVar29 = vmovlhps_avx(auVar29,auVar31);
          auVar31._0_4_ = auVar29._0_4_ * beta.values.values[0];
          auVar31._4_4_ = auVar29._4_4_ * beta.values.values[1];
          auVar31._8_4_ = auVar29._8_4_ * beta.values.values[2];
          auVar31._12_4_ = auVar29._12_4_ * beta.values.values[3];
          auVar29 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar19 = vcmpps_avx512vl(auVar29,_DAT_005c8010,4);
          auVar29 = vdivps_avx512vl(auVar31,auVar29);
          local_2e8._0_4_ =
               (float)((uint)((byte)uVar19 & 1) * auVar29._0_4_) + (float)local_2e8._0_4_;
          local_2e8._4_4_ =
               (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar29._4_4_) + (float)local_2e8._4_4_;
          fStack_2e0 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar29._8_4_) + fStack_2e0;
          fStack_2dc = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar29._12_4_) + fStack_2dc;
        }
      }
    }
    else {
      if ((this->sampleLights != true) ||
         ((_local_378 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        uVar19._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar19._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar29._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar29._8_4_ = 0x80000000;
        auVar29._12_4_ = 0x80000000;
        auVar32._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar32._4_4_ = 0x80000000;
        auVar32._8_4_ = 0x80000000;
        auVar32._12_4_ = 0x80000000;
        ls.L.values.values._0_8_ = vmovlps_avx(auVar29);
        auVar81 = ZEXT856(auVar29._8_8_);
        auVar94 = ZEXT856(auVar32._8_8_);
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        ls.L.values.values[2] = auVar32._0_4_;
        SVar95 = SurfaceInteraction::Le((SurfaceInteraction *)&si,(Vector3f *)&ls,lambda);
        auVar88._0_8_ = SVar95.values.values._8_8_;
        auVar88._8_56_ = auVar94;
        auVar43._0_8_ = SVar95.values.values._0_8_;
        auVar43._8_56_ = auVar81;
        auVar29 = vmovlhps_avx(auVar43._0_16_,auVar88._0_16_);
        auVar30._0_4_ = auVar29._0_4_ * beta.values.values[0];
        auVar30._4_4_ = auVar29._4_4_ * beta.values.values[1];
        auVar30._8_4_ = auVar29._8_4_ * beta.values.values[2];
        auVar30._12_4_ = auVar29._12_4_ * beta.values.values[3];
        auVar29 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar19 = vcmpps_avx512vl(auVar29,_DAT_005c8010,4);
        auVar29 = vdivps_avx512vl(auVar30,auVar29);
        local_2e8._0_4_ = (float)((uint)((byte)uVar19 & 1) * auVar29._0_4_) + (float)local_2e8._0_4_
        ;
        local_2e8._4_4_ =
             (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar29._4_4_) + (float)local_2e8._4_4_;
        fStack_2e0 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar29._8_4_) + fStack_2e0;
        fStack_2dc = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar29._12_4_) + fStack_2dc;
      }
      iVar16 = iVar18 + 1;
      bVar15 = true;
      bVar28 = iVar18 != this->maxDepth;
      iVar18 = iVar16;
      if (bVar28) {
        local_290.bits =
             (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_298.bits =
             (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        SurfaceInteraction::GetBSDF
                  (&bsdf,(SurfaceInteraction *)&si,ray,lambda,(CameraHandle *)&local_290,
                   scratchBuffer,(SamplerHandle *)&local_298);
        if (((ulong)bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits & 0xffffffffffff) == 0) {
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
          }
          iVar16 = 2;
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&si,ray,(Float)si.optionalValue._248_4_);
        }
        else {
          uVar20._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar20._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_2f8._0_8_ = uVar20 ^ 0x8000000080000000;
          local_2f8._8_4_ = 0x80000000;
          local_2f8._12_4_ = 0x80000000;
          auVar29 = local_2f8;
          local_2c8._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2c8._4_4_ = 0x80000000;
          local_2c8._8_4_ = 0x80000000;
          local_2c8._12_4_ = 0x80000000;
          if (this->sampleLights == true) {
            ls.L.values.values._0_8_ =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar33 = detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)&f,&ls,(ulong)ls.L.values.values._0_8_ >> 0x30);
            auVar31 = in_ZMM6._0_16_;
            sVar2 = (this->lightSampler).lights.nStored;
            if (sVar2 == 0) {
              auVar4._12_4_ = 0;
              auVar4._0_12_ = local_308._4_12_;
              local_308 = auVar4 << 0x20;
              uVar27 = 0;
            }
            else {
              auVar30 = vcvtusi2ss_avx512f(auVar31,sVar2);
              iVar16 = (int)(FVar33 * auVar30._0_4_);
              iVar21 = (int)sVar2 + -1;
              if (iVar21 < iVar16) {
                iVar16 = iVar21;
              }
              uVar27 = (this->lightSampler).lights.ptr[iVar16].
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       .bits;
              local_308._0_4_ = 1.0 / auVar30._0_4_;
            }
            if (sVar2 != 0) {
              uVar19 = (sampler->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              sVar8 = (short)(uVar19 >> 0x30);
              if (uVar19 < 0x5000000000000) {
                pHVar23 = (HaltonSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x3000000000000) {
                  if (sVar8 == 2) {
                    auVar47._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar23);
                    auVar47._8_56_ = extraout_var_03;
                    auVar30 = auVar47._0_16_;
                  }
                  else {
                    auVar51._0_8_ = HaltonSampler::Get2D(pHVar23);
                    auVar51._8_56_ = extraout_var_07;
                    auVar30 = auVar51._0_16_;
                  }
                }
                else if (sVar8 == 3) {
                  auVar49._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar23);
                  auVar49._8_56_ = extraout_var_05;
                  auVar30 = auVar49._0_16_;
                }
                else {
                  auVar53._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar23);
                  auVar53._8_56_ = extraout_var_09;
                  auVar30 = auVar53._0_16_;
                }
              }
              else {
                pDVar22 = (DebugMLTSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x7000000000000) {
                  if (sVar8 == 6) {
                    auVar48._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar22);
                    auVar48._8_56_ = extraout_var_04;
                    auVar30 = auVar48._0_16_;
                  }
                  else {
                    auVar52._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar22);
                    auVar52._8_56_ = extraout_var_08;
                    auVar30 = auVar52._0_16_;
                  }
                }
                else if (sVar8 == 7) {
                  auVar50._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar50._8_56_ = extraout_var_06;
                  auVar30 = auVar50._0_16_;
                }
                else {
                  local_328._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  local_328._4_4_ = extraout_XMM0_Db;
                  local_328._8_4_ = extraout_XMM0_Dc;
                  local_328._12_4_ = extraout_XMM0_Dd;
                  auVar54._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  auVar54._4_60_ = extraout_var;
                  auVar30 = vinsertps_avx(local_328,auVar54._0_16_,0x10);
                }
              }
              auVar45 = si.optionalValue._0_64_;
              local_1e8 = si.optionalValue._16_8_;
              local_1f8 = si.optionalValue.__align;
              uStack_1f0 = si.optionalValue._8_8_;
              uStack_1d8 = si.optionalValue._48_4_;
              local_1e0 = si.optionalValue._40_8_;
              uStack_1cc = si.optionalValue._136_4_;
              uStack_1d4 = si.optionalValue._128_4_;
              uStack_1d0 = si.optionalValue._132_4_;
              local_58 = *(undefined8 *)(lambda->lambda).values;
              uStack_50 = *(undefined8 *)((lambda->lambda).values + 2);
              uStack_48 = *(undefined8 *)(lambda->pdf).values;
              uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
              uStack_338 = CONCAT44(uStack_1d4,si.optionalValue._48_4_);
              local_330 = si.optionalValue._132_8_;
              f.values.values[0] = si.optionalValue._0_4_;
              f.values.values[1] = si.optionalValue._4_4_;
              f.values.values[2] = si.optionalValue._8_4_;
              f.values.values[3] = si.optionalValue._12_4_;
              local_348.x = (float)si.optionalValue._16_4_;
              local_348.y = (float)si.optionalValue._20_4_;
              local_348.z = (float)si.optionalValue._40_4_;
              fStack_33c = (float)si.optionalValue._44_4_;
              local_208 = vmovlps_avx(auVar30);
              local_2cc = 1;
              local_1c8 = &f;
              puStack_1c0 = &local_208;
              puStack_1b8 = &local_58;
              puStack_1b0 = &local_2cc;
              in_ZMM6 = ZEXT1664(auVar31);
              local_200 = uVar27;
              si.optionalValue._0_64_ = auVar45;
              detail::DispatchSplit<9>::operator()(&ls,&local_359,&local_200);
              fVar34 = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              if (0.0 < ls.pdf) {
                if ((ls.L.values.values[0] == 0.0) && (!NAN(ls.L.values.values[0]))) {
                  uVar19 = 0;
                  while (uVar20 = uVar19, uVar20 != 3) {
                    fVar36 = ls.L.values.values[uVar20 + 1];
                    if ((fVar36 != 0.0) || (uVar19 = uVar20 + 1, NAN(fVar36))) break;
                  }
                  if (2 < uVar20) goto LAB_0040a8b4;
                }
                local_328._4_4_ = ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                local_328._0_4_ = ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_328._8_8_ = 0;
                woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8._0_4_;
                woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._0_4_;
                woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._4_4_;
                auVar94 = ZEXT856((ulong)local_2c8._8_8_);
                auVar81 = ZEXT856((ulong)local_2f8._8_8_);
                SVar95 = BSDF::f(&bsdf,woRender,wiRender_00,Radiance);
                auVar92._0_8_ = SVar95.values.values._8_8_;
                auVar92._8_56_ = auVar94;
                auVar55._0_8_ = SVar95.values.values._0_8_;
                auVar55._8_56_ = auVar81;
                auVar31 = vmovlhps_avx(auVar55._0_16_,auVar92._0_16_);
                auVar30 = vmovshdup_avx(local_328);
                auVar32 = ZEXT416((uint)(fVar34 * (float)si.optionalValue._136_4_));
                auVar30 = vfmadd132ss_fma(auVar30,auVar32,ZEXT416((uint)si.optionalValue._132_4_));
                auVar32 = vfmsub213ss_fma(ZEXT416((uint)fVar34),
                                          ZEXT416((uint)si.optionalValue._136_4_),auVar32);
                auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ + auVar32._0_4_)),local_328,
                                          ZEXT416((uint)si.optionalValue._128_4_));
                auVar83._0_4_ = auVar30._0_4_;
                auVar83._4_4_ = auVar83._0_4_;
                auVar83._8_4_ = auVar83._0_4_;
                auVar83._12_4_ = auVar83._0_4_;
                auVar5._8_4_ = 0x7fffffff;
                auVar5._0_8_ = 0x7fffffff7fffffff;
                auVar5._12_4_ = 0x7fffffff;
                auVar30 = vandps_avx512vl(auVar83,auVar5);
                f.values.values[0] = auVar30._0_4_ * auVar31._0_4_;
                f.values.values[1] = auVar30._4_4_ * auVar31._4_4_;
                f.values.values[2] = auVar30._8_4_ * auVar31._8_4_;
                f.values.values[3] = auVar30._12_4_ * auVar31._12_4_;
                if ((f.values.values[0] == 0.0) && (!NAN(f.values.values[0]))) {
                  uVar19 = 0;
                  while (uVar20 = uVar19, uVar20 != 3) {
                    fVar34 = f.values.values[uVar20 + 1];
                    if ((fVar34 != 0.0) || (uVar19 = uVar20 + 1, NAN(fVar34))) break;
                  }
                  if (2 < uVar20) goto LAB_0040a8b4;
                }
                bVar15 = Integrator::Unoccluded((Integrator *)this,(Interaction *)&si,&ls.pLight);
                if (bVar15) {
                  auVar37._0_4_ = f.values.values[0] * beta.values.values[0] * ls.L.values.values[0]
                  ;
                  auVar37._4_4_ = f.values.values[1] * beta.values.values[1] * ls.L.values.values[1]
                  ;
                  auVar37._8_4_ = f.values.values[2] * beta.values.values[2] * ls.L.values.values[2]
                  ;
                  auVar37._12_4_ =
                       f.values.values[3] * beta.values.values[3] * ls.L.values.values[3];
                  fVar34 = (float)local_308._0_4_ * ls.pdf;
                  auVar84._0_4_ = fVar34 * (lambda->pdf).values[0];
                  auVar84._4_4_ = fVar34 * (lambda->pdf).values[1];
                  auVar84._8_4_ = fVar34 * (lambda->pdf).values[2];
                  auVar84._12_4_ = fVar34 * (lambda->pdf).values[3];
                  uVar19 = vcmpps_avx512vl(auVar84,_DAT_005c8010,4);
                  auVar31 = vdivps_avx512vl(auVar37,auVar84);
                  local_2e8._4_4_ =
                       (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar31._4_4_) +
                       (float)local_2e8._4_4_;
                  local_2e8._0_4_ =
                       (float)((uint)((byte)uVar19 & 1) * auVar31._0_4_) + (float)local_2e8._0_4_;
                  fStack_2e0 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar31._8_4_) + fStack_2e0
                  ;
                  fStack_2dc = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar31._12_4_) +
                               fStack_2dc;
                }
              }
            }
          }
LAB_0040a8b4:
          auVar31 = in_ZMM6._0_16_;
          if (this->sampleBSDF == true) {
            ls.L.values.values._0_8_ =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar33 = detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)&f,&ls,(ulong)ls.L.values.values._0_8_ >> 0x30);
            local_308._0_4_ = FVar33;
            uVar19 = (sampler->
                     super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
            sVar8 = (short)(uVar19 >> 0x30);
            if (uVar19 < 0x5000000000000) {
              pHVar23 = (HaltonSampler *)(uVar19 & 0xffffffffffff);
              if (uVar19 < 0x3000000000000) {
                if (sVar8 == 2) {
                  auVar56._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar23);
                  auVar56._8_56_ = extraout_var_10;
                  auVar29 = auVar56._0_16_;
                }
                else {
                  auVar60._0_8_ = HaltonSampler::Get2D(pHVar23);
                  auVar60._8_56_ = extraout_var_14;
                  auVar29 = auVar60._0_16_;
                }
              }
              else if (sVar8 == 3) {
                auVar58._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar23);
                auVar58._8_56_ = extraout_var_12;
                auVar29 = auVar58._0_16_;
              }
              else {
                auVar62._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar23);
                auVar62._8_56_ = extraout_var_16;
                auVar29 = auVar62._0_16_;
              }
            }
            else {
              pDVar22 = (DebugMLTSampler *)(uVar19 & 0xffffffffffff);
              if (uVar19 < 0x7000000000000) {
                if (sVar8 == 6) {
                  auVar57._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar22);
                  auVar57._8_56_ = extraout_var_11;
                  auVar29 = auVar57._0_16_;
                }
                else {
                  auVar61._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar22);
                  auVar61._8_56_ = extraout_var_15;
                  auVar29 = auVar61._0_16_;
                }
              }
              else if (sVar8 == 7) {
                auVar59._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                auVar59._8_56_ = extraout_var_13;
                auVar29 = auVar59._0_16_;
              }
              else {
                local_328._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                local_328._4_4_ = extraout_XMM0_Db_00;
                local_328._8_4_ = extraout_XMM0_Dc_00;
                local_328._12_4_ = extraout_XMM0_Dd_00;
                auVar63._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                auVar63._4_60_ = extraout_var_00;
                auVar29 = vinsertps_avx(local_328,auVar63._0_16_,0x10);
              }
            }
            ls.L.values.values._0_8_ = vmovlps_avx(auVar29);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8._0_4_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._0_4_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._4_4_;
            BSDF::Sample_f((BSDFSample *)&f,&bsdf,woRender_00,FVar33,(Point2f *)&ls,Radiance,All);
            uVar1 = uStack_338;
            fVar34 = fStack_33c;
            iVar16 = 3;
            if (0.0 < fStack_33c) {
              auVar29 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ * local_348.z
                                                      )),ZEXT416((uint)local_348.y));
              auVar31 = vfmsub213ss_fma(ZEXT416((uint)local_348.z),
                                        ZEXT416((uint)si.optionalValue._136_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ * local_348.z
                                                      )));
              auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar31._0_4_)),
                                        ZEXT416((uint)si.optionalValue._128_4_),
                                        ZEXT416((uint)local_348.x));
              uVar82 = auVar29._0_4_;
              auVar38._4_4_ = uVar82;
              auVar38._0_4_ = uVar82;
              auVar38._8_4_ = uVar82;
              auVar38._12_4_ = uVar82;
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar29 = vandps_avx512vl(auVar38,auVar6);
              auVar39._0_4_ = auVar29._0_4_ * f.values.values[0];
              auVar39._4_4_ = auVar29._4_4_ * f.values.values[1];
              auVar39._8_4_ = auVar29._8_4_ * f.values.values[2];
              auVar39._12_4_ = auVar29._12_4_ * f.values.values[3];
              auVar85._4_4_ = fStack_33c;
              auVar85._0_4_ = fStack_33c;
              auVar85._8_4_ = fStack_33c;
              auVar85._12_4_ = fStack_33c;
              auVar29 = vdivps_avx(auVar39,auVar85);
              beta.values.values[0] = auVar29._0_4_ * beta.values.values[0];
              beta.values.values[1] = auVar29._4_4_ * beta.values.values[1];
              beta.values.values[2] = auVar29._8_4_ * beta.values.values[2];
              beta.values.values[3] = auVar29._12_4_ * beta.values.values[3];
              Interaction::SpawnRay
                        ((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&local_348);
              auVar14 = (undefined1  [20])ls.pLight._32_20_;
              local_378._1_3_ = 0;
              local_378[0] = (byte)uVar1 >> 4;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = ls.L.values.values[3];
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                   ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
              *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                   CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                            ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = ls.L.values.values[0];
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = ls.L.values.values[1];
              *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                   CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
              (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (uintptr_t)
                      ls.light.
                      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      .bits;
              IVar9.high = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
              IVar9.low = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
              auVar11._4_4_ = ls.pLight.time;
              auVar11._8_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
              auVar11._0_4_ =
                   ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
              auVar11._12_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.y;
              auVar11._16_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar11._20_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.x;
              auVar11._24_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.y;
              auVar11._28_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.z;
              *(undefined1 (*) [32])&local_2b0[2].high = auVar11;
              *local_2b0 = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
              local_2b0[1] = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              local_2b0[2] = IVar9;
              local_2b0[3].low = ls.pLight.time;
              local_2b0[3].high = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
              iVar16 = 0;
              ls.pLight._32_20_ = auVar14;
            }
            auVar31 = in_ZMM6._0_16_;
            if (fVar34 <= 0.0) goto LAB_0040b6a8;
          }
          else {
            f.values.values[0] = 0.0;
            f.values.values[1] = 0.0;
            f.values.values[2] = 0.0;
            sVar8 = bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._6_2_;
            if ((ulong)bsdf.bxdf.
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                       .bits < 0x6000000000000) {
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                         .bits < 0x3000000000000) {
                pDVar24 = (DiffuseBxDF *)
                          ((ulong)bsdf.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                  .bits & 0xffffffffffff);
                if (sVar8 == 2) {
                  BVar17 = DiffuseBxDF::Flags(pDVar24);
                }
                else {
                  fVar34 = (pDVar24->R).values.values[0];
                  BVar17 = DiffuseReflection;
                  if ((fVar34 == 0.0) && (!NAN(fVar34))) {
                    uVar19 = 0xffffffffffffffff;
                    while (uVar19 != 2) {
                      fVar34 = (pDVar24->R).values.values[uVar19 + 2];
                      uVar19 = uVar19 + 1;
                      if ((fVar34 != 0.0) || (NAN(fVar34))) goto LAB_0040acbe;
                    }
                    uVar19 = 3;
LAB_0040acbe:
                    BVar17 = (uint)(uVar19 < 3) * 5;
                  }
                }
              }
              else {
                pLVar25 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          ((ulong)bsdf.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                  .bits & 0xffffffffffff);
                if (sVar8 == 4) {
                  BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                     (pLVar25);
                }
                else if (sVar8 == 3) {
                  BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                     ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                       *)pLVar25);
                }
                else {
                  vminss_avx(ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_y),
                             ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_x));
                  BVar17 = GlossyTransmission|Reflection;
                }
              }
            }
            else if ((ulong)bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits < 0x8000000000000) {
              BVar17 = SpecularTransmission|Reflection;
              if (sVar8 == 7) {
                BVar17 = GlossyReflection;
              }
            }
            else if ((ulong)bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits >> 0x30 == 8) {
              BVar17 = GlossyReflection;
            }
            else if (sVar8 == 9) {
              vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff))[1]),
                         ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff)));
              BVar17 = GlossyReflection;
            }
            else {
              BVar17 = DiffuseReflection;
            }
            if ((BVar17 & Reflection) == Unset) {
LAB_0040ae39:
              uVar19 = (sampler->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              sVar8 = (short)(uVar19 >> 0x30);
              if (uVar19 < 0x5000000000000) {
                pHVar23 = (HaltonSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x3000000000000) {
                  if (sVar8 == 2) {
                    auVar64._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar23);
                    auVar64._8_56_ = extraout_var_17;
                    local_308 = auVar64._0_16_;
                  }
                  else {
                    auVar70._0_8_ = HaltonSampler::Get2D(pHVar23);
                    auVar70._8_56_ = extraout_var_23;
                    local_308 = auVar70._0_16_;
                  }
                }
                else if (sVar8 == 3) {
                  auVar67._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar23);
                  auVar67._8_56_ = extraout_var_20;
                  local_308 = auVar67._0_16_;
                }
                else {
                  auVar72._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar23);
                  auVar72._8_56_ = extraout_var_25;
                  local_308 = auVar72._0_16_;
                }
              }
              else {
                pDVar22 = (DebugMLTSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x7000000000000) {
                  if (sVar8 == 6) {
                    auVar65._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar22);
                    auVar65._8_56_ = extraout_var_18;
                    local_308 = auVar65._0_16_;
                  }
                  else {
                    auVar71._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar22);
                    auVar71._8_56_ = extraout_var_24;
                    local_308 = auVar71._0_16_;
                  }
                }
                else if (sVar8 == 7) {
                  auVar68._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar68._8_56_ = extraout_var_21;
                  local_308 = auVar68._0_16_;
                }
                else {
                  local_378._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  local_378._4_4_ = extraout_XMM0_Db_01;
                  uStack_370 = extraout_XMM0_Dc_01;
                  uStack_36c = extraout_XMM0_Dd_01;
                  auVar73._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  auVar73._4_60_ = extraout_var_01;
                  local_308 = vinsertps_avx(_local_378,auVar73._0_16_,0x10);
                }
              }
              auVar30 = vfnmadd213ss_fma(local_308,local_308,ZEXT416(0x3f800000));
              auVar30 = vmaxss_avx(auVar30,ZEXT816(0) << 0x40);
              if (auVar30._0_4_ < 0.0) {
                fVar34 = sqrtf(auVar30._0_4_);
              }
              else {
                auVar30 = vsqrtss_avx(auVar30,auVar30);
                fVar34 = auVar30._0_4_;
              }
              auVar30 = vmovshdup_avx(local_308);
              fVar36 = auVar30._0_4_ * 6.2831855;
              fVar35 = cosf(fVar36);
              local_328 = ZEXT416((uint)(fVar35 * fVar34));
              fVar36 = sinf(fVar36);
              auVar30 = vinsertps_avx(local_328,ZEXT416((uint)(fVar36 * fVar34)),0x10);
              uVar1 = vmovlps_avx(auVar30);
              f.values.values[0] = (float)uVar1;
              f.values.values[1] = (float)((ulong)uVar1 >> 0x20);
              f.values.values[2] = (float)local_308._0_4_;
              sVar8 = bsdf.bxdf.
                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                      .bits._6_2_;
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                         .bits < 0x6000000000000) {
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits < 0x3000000000000) {
                  pDVar24 = (DiffuseBxDF *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                    .bits & 0xffffffffffff);
                  if (sVar8 == 2) {
                    BVar17 = DiffuseBxDF::Flags(pDVar24);
                  }
                  else {
                    fVar34 = (pDVar24->R).values.values[0];
                    BVar17 = DiffuseReflection;
                    if ((fVar34 == 0.0) && (!NAN(fVar34))) {
                      uVar19 = 0xffffffffffffffff;
                      while (uVar19 != 2) {
                        fVar34 = (pDVar24->R).values.values[uVar19 + 2];
                        uVar19 = uVar19 + 1;
                        if ((fVar34 != 0.0) || (NAN(fVar34))) goto LAB_0040b2c0;
                      }
                      uVar19 = 3;
LAB_0040b2c0:
                      BVar17 = (uint)(uVar19 < 3) * 5;
                    }
                  }
                }
                else {
                  pLVar25 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                    .bits & 0xffffffffffff);
                  if (sVar8 == 4) {
                    BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                       (pLVar25);
                  }
                  else if (sVar8 == 3) {
                    BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                             Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                    *)pLVar25);
                  }
                  else {
                    vminss_avx(ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_y),
                               ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_x));
                    BVar17 = GlossyTransmission|Reflection;
                  }
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                              .bits < 0x8000000000000) {
                BVar17 = SpecularTransmission|Reflection;
                if (sVar8 == 7) {
                  BVar17 = GlossyReflection;
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                              .bits >> 0x30 == 8) {
                BVar17 = GlossyReflection;
              }
              else if (sVar8 == 9) {
                vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff))[1]),
                           ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff)));
                BVar17 = GlossyReflection;
              }
              else {
                BVar17 = DiffuseReflection;
              }
              if ((BVar17 & Reflection) == Unset) {
LAB_0040b355:
                sVar8 = bsdf.bxdf.
                        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                        .bits._6_2_;
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits < 0x6000000000000) {
                  if ((ulong)bsdf.bxdf.
                             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                             .bits < 0x3000000000000) {
                    pDVar24 = (DiffuseBxDF *)
                              ((ulong)bsdf.bxdf.
                                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                      .bits & 0xffffffffffff);
                    if (sVar8 == 2) {
                      BVar17 = DiffuseBxDF::Flags(pDVar24);
                    }
                    else {
                      fVar34 = (pDVar24->R).values.values[0];
                      BVar17 = Unset;
                      if ((fVar34 == 0.0) && (!NAN(fVar34))) {
                        uVar19 = 0xffffffffffffffff;
                        while (uVar19 != 2) {
                          fVar34 = (pDVar24->R).values.values[uVar19 + 2];
                          uVar19 = uVar19 + 1;
                          if ((fVar34 != 0.0) || (NAN(fVar34))) goto LAB_0040b4a8;
                        }
                        uVar19 = 3;
LAB_0040b4a8:
                        BVar17 = (uint)(uVar19 < 3) * 5;
                      }
                    }
                  }
                  else {
                    pLVar25 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                              ((ulong)bsdf.bxdf.
                                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                      .bits & 0xffffffffffff);
                    if (sVar8 == 4) {
                      BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               Flags(pLVar25);
                    }
                    else if (sVar8 == 3) {
                      BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                               Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                      *)pLVar25);
                    }
                    else {
                      vminss_avx(ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_y),
                                 ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_x));
                      BVar17 = GlossyTransmission|Reflection;
                    }
                  }
                }
                else if ((ulong)bsdf.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                .bits < 0x8000000000000) {
                  BVar17 = SpecularTransmission|Reflection;
                  if (sVar8 == 7) {
                    BVar17 = Unset;
                  }
                }
                else if ((ulong)bsdf.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                .bits >> 0x30 == 8) {
                  BVar17 = Unset;
                }
                else if (sVar8 == 9) {
                  vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                            
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff))[1]),
                             ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                            
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff)));
                  BVar17 = Unset;
                }
                else {
                  BVar17 = Unset;
                }
                auVar30 = SUB6416(ZEXT464(0x3e22f983),0);
                if ((BVar17 & Transmission) != Unset) {
                  auVar31 = vmovshdup_avx(auVar29);
                  auVar30 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2c8._0_4_));
                  auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)si.optionalValue._44_4_),auVar30);
                  auVar30 = vfmsub213ss_fma(local_2c8,ZEXT416((uint)si.optionalValue._48_4_),auVar30
                                           );
                  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ + auVar30._0_4_)),
                                            ZEXT416((uint)si.optionalValue._40_4_),auVar29);
                  auVar40._4_4_ = f.values.values[1];
                  auVar40._0_4_ = f.values.values[0];
                  auVar40._8_8_ = 0;
                  auVar29 = vmovshdup_avx(auVar40);
                  auVar31 = vfmadd213ss_fma(auVar29,ZEXT416((uint)si.optionalValue._44_4_),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          f.values.values[2])));
                  auVar29 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                            ZEXT416((uint)f.values.values[2]),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          f.values.values[2])));
                  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ + auVar29._0_4_)),auVar40,
                                            ZEXT416((uint)si.optionalValue._40_4_));
                  auVar30 = SUB6416(ZEXT464(0x3e22f983),0);
                  if (0.0 < auVar32._0_4_ * auVar29._0_4_) goto LAB_0040b549;
                }
              }
              else {
                auVar31 = vmovshdup_avx(auVar29);
                auVar30 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2c8._0_4_));
                auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)si.optionalValue._44_4_),auVar30);
                auVar30 = vfmsub231ss_fma(auVar30,ZEXT416((uint)si.optionalValue._48_4_),local_2c8);
                auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ + auVar30._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar29);
                auVar40._4_4_ = f.values.values[1];
                auVar40._0_4_ = f.values.values[0];
                auVar40._8_8_ = 0;
                auVar31 = vmovshdup_avx(auVar40);
                auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar32 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_)),auVar40,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                if (0.0 <= auVar30._0_4_ * auVar32._0_4_) goto LAB_0040b355;
LAB_0040b549:
                auVar41._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
                auVar41._8_4_ = auVar40._8_4_ ^ 0x80000000;
                auVar41._12_4_ = auVar40._12_4_ ^ 0x80000000;
                f.values.values[2] = -f.values.values[2];
                uVar1 = vmovlps_avx(auVar41);
                f.values.values[0] = (float)uVar1;
                f.values.values[1] = (float)((ulong)uVar1 >> 0x20);
                auVar30 = SUB6416(ZEXT464(0x3e22f983),0);
              }
            }
            else {
              sVar8 = bsdf.bxdf.
                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                      .bits._6_2_;
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                         .bits < 0x6000000000000) {
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits < 0x3000000000000) {
                  pDVar24 = (DiffuseBxDF *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                    .bits & 0xffffffffffff);
                  if (sVar8 == 2) {
                    BVar17 = DiffuseBxDF::Flags(pDVar24);
                  }
                  else {
                    fVar34 = (pDVar24->R).values.values[0];
                    BVar17 = Unset;
                    if ((fVar34 == 0.0) && (!NAN(fVar34))) {
                      uVar19 = 0xffffffffffffffff;
                      while (uVar19 != 2) {
                        fVar34 = (pDVar24->R).values.values[uVar19 + 2];
                        uVar19 = uVar19 + 1;
                        if ((fVar34 != 0.0) || (NAN(fVar34))) goto LAB_0040ae25;
                      }
                      uVar19 = 3;
LAB_0040ae25:
                      BVar17 = (uint)(uVar19 < 3) * 5;
                    }
                  }
                }
                else {
                  pLVar25 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                    .bits & 0xffffffffffff);
                  if (sVar8 == 4) {
                    BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                       (pLVar25);
                  }
                  else if (sVar8 == 3) {
                    BVar17 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                             Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                    *)pLVar25);
                  }
                  else {
                    vminss_avx(ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_y),
                               ZEXT416((uint)(pLVar25->top).mfDistrib.alpha_x));
                    BVar17 = GlossyTransmission|Reflection;
                  }
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                              .bits < 0x8000000000000) {
                BVar17 = SpecularTransmission|Reflection;
                if (sVar8 == 7) {
                  BVar17 = Unset;
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                              .bits >> 0x30 == 8) {
                BVar17 = Unset;
              }
              else if (sVar8 == 9) {
                vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff))[1]),
                           ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                                                  .bits & 0xffffffffffff)));
                BVar17 = Unset;
              }
              else {
                BVar17 = Unset;
              }
              if ((BVar17 & Transmission) == Unset) goto LAB_0040ae39;
              uVar19 = (sampler->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              sVar8 = (short)(uVar19 >> 0x30);
              if (uVar19 < 0x5000000000000) {
                pHVar23 = (HaltonSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x3000000000000) {
                  if (sVar8 == 2) {
                    auVar66._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar23);
                    auVar66._8_56_ = extraout_var_19;
                    auVar29 = auVar66._0_16_;
                  }
                  else {
                    auVar76._0_8_ = HaltonSampler::Get2D(pHVar23);
                    auVar76._8_56_ = extraout_var_28;
                    auVar29 = auVar76._0_16_;
                  }
                }
                else if (sVar8 == 3) {
                  auVar74._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar23);
                  auVar74._8_56_ = extraout_var_26;
                  auVar29 = auVar74._0_16_;
                }
                else {
                  auVar78._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar23);
                  auVar78._8_56_ = extraout_var_30;
                  auVar29 = auVar78._0_16_;
                }
              }
              else {
                pDVar22 = (DebugMLTSampler *)(uVar19 & 0xffffffffffff);
                if (uVar19 < 0x7000000000000) {
                  if (sVar8 == 6) {
                    auVar69._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar22);
                    auVar69._8_56_ = extraout_var_22;
                    auVar29 = auVar69._0_16_;
                  }
                  else {
                    auVar77._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar22);
                    auVar77._8_56_ = extraout_var_29;
                    auVar29 = auVar77._0_16_;
                  }
                }
                else if (sVar8 == 7) {
                  auVar75._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar75._8_56_ = extraout_var_27;
                  auVar29 = auVar75._0_16_;
                }
                else {
                  local_378._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  local_378._4_4_ = extraout_XMM0_Db_02;
                  uStack_370 = extraout_XMM0_Dc_02;
                  uStack_36c = extraout_XMM0_Dd_02;
                  auVar79._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  auVar79._4_60_ = extraout_var_02;
                  auVar29 = vinsertps_avx(_local_378,auVar79._0_16_,0x10);
                }
              }
              local_308 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar29,ZEXT416(0xc0000000)
                                         );
              auVar30 = vfnmadd213ss_fma(local_308,local_308,SUB6416(ZEXT464(0x3f800000),0));
              auVar30 = vmaxss_avx(auVar30,ZEXT816(0));
              if (auVar30._0_4_ < 0.0) {
                local_328 = auVar29;
                fVar34 = sqrtf(auVar30._0_4_);
                auVar29 = local_328;
              }
              else {
                auVar30 = vsqrtss_avx(auVar30,auVar30);
                fVar34 = auVar30._0_4_;
              }
              auVar29 = vmovshdup_avx(auVar29);
              fVar36 = auVar29._0_4_ * 6.2831855;
              fVar35 = cosf(fVar36);
              local_328 = ZEXT416((uint)(fVar35 * fVar34));
              fVar36 = sinf(fVar36);
              auVar29 = vinsertps_avx(local_328,ZEXT416((uint)(fVar36 * fVar34)),0x10);
              uVar1 = vmovlps_avx(auVar29);
              f.values.values[0] = (float)uVar1;
              f.values.values[1] = (float)((ulong)uVar1 >> 0x20);
              auVar30 = SUB6416(ZEXT464(0x3da2f983),0);
              f.values.values[2] = (float)local_308._0_4_;
            }
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = f.values.values[1];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = f.values.values[0];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = f.values.values[2];
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8._0_4_;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._0_4_;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._4_4_;
            auVar94 = ZEXT856((ulong)local_2c8._8_8_);
            auVar81 = ZEXT856((ulong)local_2f8._8_8_);
            SVar95 = BSDF::f(&bsdf,woRender_01,wiRender,Radiance);
            auVar93._0_8_ = SVar95.values.values._8_8_;
            auVar93._8_56_ = auVar94;
            auVar80._0_8_ = SVar95.values.values._0_8_;
            auVar80._8_56_ = auVar81;
            auVar29 = vmovlhps_avx(auVar80._0_16_,auVar93._0_16_);
            auVar32 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])),
                                      ZEXT416((uint)f.values.values[1]));
            auVar4 = vfmsub213ss_fma(ZEXT416((uint)f.values.values[2]),
                                     ZEXT416((uint)si.optionalValue._136_4_),
                                     ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                   f.values.values[2])));
            auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar4._0_4_)),
                                      ZEXT416((uint)si.optionalValue._128_4_),
                                      ZEXT416((uint)f.values.values[0]));
            auVar86._0_4_ = auVar32._0_4_;
            auVar86._4_4_ = auVar86._0_4_;
            auVar86._8_4_ = auVar86._0_4_;
            auVar86._12_4_ = auVar86._0_4_;
            auVar7._8_4_ = 0x7fffffff;
            auVar7._0_8_ = 0x7fffffff7fffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar32 = vandps_avx512vl(auVar86,auVar7);
            auVar42._0_4_ = auVar32._0_4_ * auVar29._0_4_;
            auVar42._4_4_ = auVar32._4_4_ * auVar29._4_4_;
            auVar42._8_4_ = auVar32._8_4_ * auVar29._8_4_;
            auVar42._12_4_ = auVar32._12_4_ * auVar29._12_4_;
            local_378._0_4_ = auVar30._0_4_;
            auVar87._4_4_ = local_378._0_4_;
            auVar87._0_4_ = local_378._0_4_;
            auVar87._8_4_ = local_378._0_4_;
            auVar87._12_4_ = local_378._0_4_;
            auVar29 = vdivps_avx(auVar42,auVar87);
            beta.values.values[0] = auVar29._0_4_ * beta.values.values[0];
            beta.values.values[1] = auVar29._4_4_ * beta.values.values[1];
            beta.values.values[2] = auVar29._8_4_ * beta.values.values[2];
            beta.values.values[3] = auVar29._12_4_ * beta.values.values[3];
            Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&f);
            auVar14 = (undefined1  [20])ls.pLight._32_20_;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = ls.L.values.values[3];
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                 ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                          ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = ls.L.values.values[0];
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = ls.L.values.values[1];
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (uintptr_t)
                    ls.light.
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    .bits;
            IVar10.high = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
            IVar10.low = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
            auVar12._4_4_ = ls.pLight.time;
            auVar12._8_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            auVar12._0_4_ =
                 ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
            auVar12._12_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar12._16_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar12._20_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.x;
            auVar12._24_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.y;
            auVar12._28_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.z;
            *(undefined1 (*) [32])&local_2b0[2].high = auVar12;
            *local_2b0 = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
            local_2b0[1] = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
            local_2b0[2] = IVar10;
            local_2b0[3].low = ls.pLight.time;
            local_2b0[3].high = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            stack0xfffffffffffffc8c = auVar30._4_12_;
            auVar13._12_4_ = 0;
            auVar13._0_12_ = stack0xfffffffffffffc8c;
            _local_378 = auVar13 << 0x20;
            ls.pLight._32_20_ = auVar14;
          }
          in_ZMM6 = ZEXT1664(auVar31);
          FVar33 = SampledSpectrum::y(&beta,lambda);
          ls.L.values.values[0] = FVar33;
          f.values.values[0] = 0.0;
          if (FVar33 < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                       ,0x214,"Check failed: %s >= %s with %s = %s, %s = %s",
                       (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                       (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",(float *)&f)
            ;
          }
          iVar16 = 0;
        }
LAB_0040b6a8:
        bVar15 = iVar16 == 3;
      }
    }
    if (si.set == true) {
      si._256_8_ = si._256_8_ & 0xffffffffffffff00;
    }
  } while (!bVar15);
  auVar29 = vshufpd_avx(_local_2e8,_local_2e8,1);
  SVar95.values.values._0_8_ = local_2e8;
  SVar95.values.values._8_8_ = auVar29._0_8_;
  return (SampledSpectrum)SVar95.values.values;
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;

    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                LightLiSample ls = sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls.L) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls.wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls.pLight))
                        L += SafeDiv(beta * f * ls.L,
                                     sampledLight->pdf * ls.pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
            specularBounce = bs.IsSpecular();
            ray = isect.SpawnRay(bs.wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}